

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thrift.h
# Opt level: O2

void __thiscall duckdb_apache::thrift::TException::~TException(TException *this)

{
  *(undefined ***)this = &PTR__TException_017b2d60;
  std::__cxx11::string::~string((string *)&this->message_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~TException() noexcept override = default;